

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

mat33 * nifti_mat33_mul(mat33 A,mat33 B)

{
  mat33 *in_RDI;
  int local_10;
  int local_c;
  int j;
  int i;
  
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
      in_RDI->m[local_c][local_10] =
           A.m[local_c][0] * B.m[1][(long)local_10 + 1] +
           A.m[(long)local_c + -1][1] * A.m[2][(long)local_10 + 2] +
           A.m[(long)local_c + -1][2] * B.m[0][(long)local_10 + 1];
    }
  }
  return in_RDI;
}

Assistant:

mat33 nifti_mat33_mul( mat33 A , mat33 B )  /* multiply 2 3x3 matrices */
{
   mat33 C ; int i,j ;
   for( i=0 ; i < 3 ; i++ )
    for( j=0 ; j < 3 ; j++ )
      C.m[i][j] =  A.m[i][0] * B.m[0][j]
                 + A.m[i][1] * B.m[1][j]
                 + A.m[i][2] * B.m[2][j] ;
   return C ;
}